

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

void __thiscall FIX::DataDictionary::setVersion(DataDictionary *this,string *beginString)

{
  pointer pcVar1;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  char local_48 [16];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  field_metrics local_18;
  
  local_68._0_8_ = &PTR__FieldBase_003239f8;
  local_68._8_4_ = 8;
  local_58._M_p = local_48;
  pcVar1 = (beginString->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + beginString->_M_string_length);
  local_38._M_p = (pointer)&local_28;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_18.m_length = 0;
  local_18.m_checksum = 0;
  local_68._0_8_ = &PTR__FieldBase_00328470;
  *(undefined4 *)(this + 0x18) = local_68._8_4_;
  std::__cxx11::string::_M_assign((string *)(this + 0x20));
  *(field_metrics *)(this + 0x60) = local_18;
  *(undefined8 *)(this + 0x48) = 0;
  **(undefined1 **)(this + 0x40) = 0;
  FieldBase::~FieldBase((FieldBase *)local_68);
  this[8] = (DataDictionary)0x1;
  return;
}

Assistant:

void setVersion(const std::string &beginString) {
    m_beginString = beginString;
    m_hasVersion = true;
  }